

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

xmlChar * xmlStringLenDecodeEntities
                    (xmlParserCtxtPtr ctxt,xmlChar *str,int len,int what,xmlChar end,xmlChar end2,
                    xmlChar end3)

{
  byte *pbVar1;
  xmlChar xVar2;
  xmlParserInputState xVar3;
  getParameterEntitySAXFunc p_Var4;
  xmlGenericErrorFunc p_Var5;
  xmlParserInputPtr pxVar6;
  getEntitySAXFunc p_Var7;
  byte bVar8;
  uint uVar9;
  int iVar10;
  xmlEntityType xVar11;
  xmlChar *pxVar12;
  int *piVar13;
  xmlGenericErrorFunc *pp_Var14;
  void **ppvVar15;
  xmlChar *pxVar16;
  xmlEntityPtr ent;
  xmlChar *pxVar17;
  xmlParserInputPtr input;
  char *pcVar18;
  xmlChar *pxVar19;
  xmlParserErrors xVar20;
  size_t sVar21;
  size_t sVar22;
  undefined7 in_register_00000081;
  xmlChar *str2;
  ulong uVar23;
  ulong uVar24;
  byte *pbVar25;
  bool bVar26;
  bool bVar27;
  xmlEntityPtr local_70;
  byte *local_60;
  ulong local_58;
  uint local_4c;
  xmlBufferPtr local_48;
  int l;
  uint local_3c;
  byte *local_38;
  
  str2 = (xmlChar *)CONCAT71(in_register_00000081,end);
  if (-1 < len && (str != (xmlChar *)0x0 && ctxt != (xmlParserCtxtPtr)0x0)) {
    local_4c = what;
    if ((0x28 < ctxt->depth) && ((0x400 < (uint)ctxt->depth || ((ctxt->options & 0x80000U) == 0))))
    {
      xmlFatalErr(ctxt,XML_ERR_ENTITY_LOOP,(char *)0x0);
      return (xmlChar *)0x0;
    }
    pxVar12 = (xmlChar *)(*xmlMallocAtomic)(300);
    pxVar16 = (xmlChar *)0x0;
    if (pxVar12 != (xmlChar *)0x0) {
      local_38 = (byte *)(ulong)(uint)len;
      if (len != 0) {
        uVar9 = xmlStringCurrentChar(ctxt,str,&l);
        pxVar16 = (xmlChar *)(ulong)uVar9;
      }
      local_38 = str + (long)local_38;
      local_3c = (uint)end3;
      local_58 = 300;
      sVar21 = 0;
      do {
        uVar9 = (uint)pxVar16;
        if ((((uVar9 == local_3c) || (uVar9 == end2)) || (uVar9 == 0)) ||
           ((uVar9 == end || (ctxt->instate == XML_PARSER_EOF)))) {
          pxVar12[sVar21] = '\0';
          return pxVar12;
        }
        pxVar17 = pxVar12;
        sVar22 = sVar21;
        if (uVar9 == 0x26) {
          if (str[1] == 0x23) {
            if (*str == 0x26) {
              bVar8 = str[2];
              if (bVar8 == 0x78) {
                pbVar25 = str + 3;
                uVar9 = 0;
                while( true ) {
                  bVar8 = *pbVar25;
                  if (bVar8 == 0x3b) break;
                  if (9 < (byte)(bVar8 - 0x30)) {
                    if ((byte)(bVar8 + 0x9f) < 6) {
                      uVar9 = (uVar9 * 0x10 + (uint)bVar8) - 0x57;
                      goto LAB_00157c60;
                    }
                    if ((byte)(bVar8 + 0xbf) < 6) {
                      uVar9 = (uVar9 * 0x10 + (uint)bVar8) - 0x37;
                      goto LAB_00157c60;
                    }
                    xVar20 = XML_ERR_INVALID_HEX_CHARREF;
LAB_001589aa:
                    uVar9 = 0;
                    xmlFatalErr(ctxt,xVar20,(char *)0x0);
                    goto LAB_001589b8;
                  }
                  uVar9 = (uVar9 * 0x10 + (uint)bVar8) - 0x30;
LAB_00157c60:
                  if (0x10ffff < (int)uVar9) {
                    uVar9 = 0x110000;
                  }
                  pbVar25 = pbVar25 + 1;
                }
              }
              else {
                pbVar25 = str + 2;
                uVar9 = 0;
                while (bVar8 != 0x3b) {
                  if (9 < (byte)(bVar8 - 0x30)) {
                    xVar20 = XML_ERR_INVALID_DEC_CHARREF;
                    goto LAB_001589aa;
                  }
                  uVar9 = ((uint)bVar8 + uVar9 * 10) - 0x30;
                  if (0x10ffff < (int)uVar9) {
                    uVar9 = 0x110000;
                  }
                  pbVar1 = pbVar25 + 1;
                  pbVar25 = pbVar25 + 1;
                  bVar8 = *pbVar1;
                }
              }
              if ((int)uVar9 < 0x110000) {
                if ((int)uVar9 < 0x100) {
                  if ((0x1f < (int)uVar9) ||
                     ((uVar9 < 0xe && ((0x2600U >> (uVar9 & 0x1f) & 1) != 0)))) {
LAB_00157f28:
                    str = pbVar25 + 1;
                    iVar10 = xmlCopyCharMultiByte(pxVar12 + sVar21,uVar9);
                    sVar22 = sVar21 + (long)iVar10;
                    uVar24 = local_58;
                    if ((long)iVar10 + sVar21 + 100 <= local_58) goto LAB_001587d4;
                    uVar24 = local_58 * 2 + 100;
                    if (local_58 <= uVar24) {
                      pxVar17 = (xmlChar *)(*xmlRealloc)(pxVar12,uVar24);
                      goto joined_r0x00157dc1;
                    }
                    pxVar16 = (xmlChar *)0x0;
                    goto LAB_0015896d;
                  }
                }
                else if (uVar9 - 0x10000 < 0xffffd800 || uVar9 - 0xe000 < 0x1ffe) goto LAB_00157f28;
LAB_001589b8:
                pcVar18 = "xmlParseStringCharRef: invalid xmlChar value %d\n";
              }
              else {
                pcVar18 = "xmlParseStringCharRef: character reference out of bounds\n";
              }
              xmlFatalErrMsgInt(ctxt,XML_ERR_INVALID_CHAR,pcVar18,uVar9);
            }
            else {
              xmlFatalErr(ctxt,XML_ERR_INVALID_CHARREF,(char *)0x0);
            }
            goto LAB_001589d2;
          }
          if ((local_4c & 1) == 0) goto LAB_00157d44;
          piVar13 = __xmlParserDebugEntities();
          if (*piVar13 != 0) {
            pp_Var14 = __xmlGenericError();
            p_Var5 = *pp_Var14;
            ppvVar15 = __xmlGenericErrorContext();
            (*p_Var5)(*ppvVar15,"String decoding Entity Reference: %.30s\n",str);
          }
          local_60 = str;
          if (*str == 0x26) {
            local_60 = str + 1;
            pxVar16 = xmlParseStringName(ctxt,&local_60);
            pbVar25 = local_60;
            if (pxVar16 == (xmlChar *)0x0) {
              xmlFatalErrMsg(ctxt,XML_ERR_NAME_REQUIRED,"xmlParseStringEntityRef: no name\n");
              goto LAB_0015825c;
            }
            if (*local_60 == 0x3b) {
              pbVar25 = local_60 + 1;
              if (((ctxt->options & 0x100000) == 0) &&
                 (ent = xmlGetPredefinedEntity(pxVar16), ent != (xmlEntityPtr)0x0)) {
                (*xmlFree)(pxVar16);
                str = pbVar25;
              }
              else {
                ctxt->nbentities = ctxt->nbentities + 1;
                if (ctxt->sax == (_xmlSAXHandler *)0x0) {
LAB_00158359:
                  ent = (xmlEntityPtr)0x0;
                }
                else {
                  p_Var7 = ctxt->sax->getEntity;
                  if (((p_Var7 == (getEntitySAXFunc)0x0) ||
                      (ent = (*p_Var7)(ctxt->userData,pxVar16), ent == (xmlEntityPtr)0x0)) &&
                     (((ctxt->options & 0x100000) == 0 ||
                      (ent = xmlGetPredefinedEntity(pxVar16), ent == (xmlEntityPtr)0x0)))) {
                    if ((xmlParserCtxtPtr)ctxt->userData != ctxt) goto LAB_00158359;
                    ent = xmlSAX2GetEntity(ctxt,pxVar16);
                  }
                }
                xVar3 = ctxt->instate;
                if (xVar3 == XML_PARSER_EOF) {
                  (*xmlFree)(pxVar16);
                  ent = (xmlEntityPtr)0x0;
                }
                else {
                  if (ent == (xmlEntityPtr)0x0) {
                    if ((ctxt->standalone == 1) ||
                       ((ctxt->hasExternalSubset == 0 && (ctxt->hasPErefs == 0)))) {
                      xmlFatalErrMsgStr(ctxt,XML_ERR_UNDECLARED_ENTITY,"Entity \'%s\' not defined\n"
                                        ,pxVar16);
                    }
                    else {
                      xmlErrMsgStr(ctxt,XML_WAR_UNDECLARED_ENTITY,"Entity \'%s\' not defined\n",
                                   pxVar16);
                    }
                    xmlParserEntityCheck(ctxt,0,(xmlEntityPtr)0x0,0);
                  }
                  else {
                    xVar11 = ent->etype;
                    if (xVar11 == XML_EXTERNAL_GENERAL_UNPARSED_ENTITY) {
                      xVar20 = XML_ERR_UNPARSED_ENTITY;
                      pcVar18 = "Entity reference to unparsed entity %s\n";
                    }
                    else if ((xVar3 == XML_PARSER_ATTRIBUTE_VALUE) &&
                            (xVar11 == XML_EXTERNAL_GENERAL_PARSED_ENTITY)) {
                      xVar20 = XML_ERR_ENTITY_IS_EXTERNAL;
                      pcVar18 = "Attribute references external entity \'%s\'\n";
                    }
                    else {
                      if ((xVar3 == XML_PARSER_ATTRIBUTE_VALUE) &&
                         (xVar11 != XML_INTERNAL_PREDEFINED_ENTITY && ent->content != (xmlChar *)0x0
                         )) {
                        pxVar19 = xmlStrchr(ent->content,'<');
                        if (pxVar19 != (xmlChar *)0x0) {
                          xVar20 = XML_ERR_LT_IN_ATTRIBUTE;
                          pcVar18 = "\'<\' in entity \'%s\' is not allowed in attributes values\n";
                          goto LAB_001586fe;
                        }
                        xVar11 = ent->etype;
                      }
                      if ((xVar11 & ~XML_INTERNAL_GENERAL_ENTITY) != XML_INTERNAL_PARAMETER_ENTITY)
                      goto LAB_00158706;
                      xVar20 = XML_ERR_ENTITY_IS_PARAMETER;
                      pcVar18 = "Attempt to reference the parameter entity \'%s\'\n";
                    }
LAB_001586fe:
                    xmlFatalErrMsgStr(ctxt,xVar20,pcVar18,pxVar16);
                  }
LAB_00158706:
                  (*xmlFree)(pxVar16);
                  str = pbVar25;
                }
              }
            }
            else {
              xmlFatalErr(ctxt,XML_ERR_ENTITYREF_SEMICOL_MISSING,(char *)0x0);
              (*xmlFree)(pxVar16);
              ent = (xmlEntityPtr)0x0;
              str = pbVar25;
            }
          }
          else {
LAB_0015825c:
            ent = (xmlEntityPtr)0x0;
            str = local_60;
          }
          xmlParserEntityCheck(ctxt,0,ent,0);
          uVar24 = local_58;
          if (ent != (xmlEntityPtr)0x0) {
            ctxt->nbentities = ctxt->nbentities + (long)(ent->checked / 2);
            pbVar25 = ent->content;
            if (ent->etype == XML_INTERNAL_PREDEFINED_ENTITY) {
              if (pbVar25 == (byte *)0x0) {
                xmlFatalErrMsg(ctxt,XML_ERR_INTERNAL_ERROR,"predefined entity has no content\n");
                goto LAB_001589d2;
              }
              iVar10 = xmlCopyCharMultiByte(pxVar12 + sVar21,(uint)*pbVar25);
              sVar22 = sVar21 + (long)iVar10;
              uVar24 = local_58;
              if ((local_58 < (long)iVar10 + sVar21 + 100) &&
                 ((uVar24 = local_58 * 2 + 100, uVar24 < local_58 ||
                  (pxVar17 = (xmlChar *)(*xmlRealloc)(pxVar12,uVar24), pxVar17 == (xmlChar *)0x0))))
              goto LAB_001589f8;
            }
            else if (pbVar25 == (byte *)0x0) {
              iVar10 = xmlStrlen(ent->name);
              pxVar16 = ent->name;
              pxVar12[sVar21] = '&';
              uVar24 = local_58;
              if ((local_58 < sVar21 + (long)iVar10 + 0x65) &&
                 ((uVar24 = (long)iVar10 + local_58 * 2 + 100, uVar24 < local_58 ||
                  (pxVar17 = (xmlChar *)(*xmlRealloc)(pxVar12,uVar24), pxVar17 == (xmlChar *)0x0))))
              {
                pxVar16 = (xmlChar *)0x0;
                goto LAB_0015896d;
              }
              sVar22 = sVar21 + 2;
              for (; 0 < iVar10; iVar10 = iVar10 + -1) {
                xVar2 = *pxVar16;
                pxVar16 = pxVar16 + 1;
                pxVar17[sVar22 - 1] = xVar2;
                sVar22 = sVar22 + 1;
              }
              pxVar17[sVar22 - 1] = ';';
            }
            else {
              ctxt->depth = ctxt->depth + 1;
              str2 = (xmlChar *)0x0;
              pxVar16 = xmlStringDecodeEntities(ctxt,pbVar25,local_4c,'\0','\0','\0');
              ctxt->depth = ctxt->depth + -1;
              pxVar17 = pxVar16;
              uVar24 = local_58;
              pxVar19 = pxVar12;
              if (pxVar16 == (xmlChar *)0x0) goto LAB_001589d2;
              while (pxVar12 = pxVar19, *pxVar17 != '\0') {
                pxVar19 = pxVar17 + 1;
                sVar22 = sVar21 + 1;
                pxVar12[sVar21] = *pxVar17;
                uVar23 = sVar21 + 0x65;
                pxVar17 = pxVar19;
                sVar21 = sVar22;
                pxVar19 = pxVar12;
                if (uVar24 < uVar23) {
                  iVar10 = xmlParserEntityCheck(ctxt,sVar22,ent,0);
                  if (iVar10 != 0) goto LAB_00158977;
                  uVar23 = uVar24 * 2 + 100;
                  if ((uVar23 < uVar24) ||
                     (pxVar19 = (xmlChar *)(*xmlRealloc)(pxVar12,uVar23), uVar24 = uVar23,
                     pxVar19 == (xmlChar *)0x0)) goto LAB_0015896d;
                }
              }
              local_58 = uVar24;
              (*xmlFree)(pxVar16);
              sVar22 = sVar21;
              pxVar17 = pxVar12;
              uVar24 = local_58;
            }
          }
        }
        else if (((local_4c & 2) == 0) || (uVar9 != 0x25)) {
LAB_00157d44:
          if (l == 1) {
            pxVar12[sVar21] = (xmlChar)pxVar16;
            sVar22 = sVar21 + 1;
          }
          else {
            iVar10 = xmlCopyCharMultiByte(pxVar12 + sVar21,uVar9);
            sVar22 = sVar21 + (long)iVar10;
          }
          str = str + l;
          uVar24 = local_58;
          if (local_58 < sVar22 + 100) {
            uVar24 = local_58 * 2 + 100;
            if (local_58 <= uVar24) {
              pxVar17 = (xmlChar *)(*xmlRealloc)(pxVar12,uVar24);
joined_r0x00157dc1:
              if (pxVar17 != (xmlChar *)0x0) goto LAB_001587d4;
            }
LAB_001589f8:
            pxVar16 = (xmlChar *)0x0;
            goto LAB_0015896d;
          }
        }
        else {
          piVar13 = __xmlParserDebugEntities();
          if (*piVar13 != 0) {
            pp_Var14 = __xmlGenericError();
            p_Var5 = *pp_Var14;
            ppvVar15 = __xmlGenericErrorContext();
            (*p_Var5)(*ppvVar15,"String decoding PE Reference: %.30s\n",str);
          }
          if (str == (byte *)0x0) {
            str = (byte *)0x0;
LAB_00157fe2:
            local_70 = (xmlEntityPtr)0x0;
          }
          else {
            local_60 = str;
            if (*str != 0x25) goto LAB_00157fe2;
            local_60 = str + 1;
            pxVar16 = xmlParseStringName(ctxt,&local_60);
            str = local_60;
            if (pxVar16 == (xmlChar *)0x0) {
              xmlFatalErrMsg(ctxt,XML_ERR_NAME_REQUIRED,"xmlParseStringPEReference: no name\n");
              str = local_60;
              goto LAB_00157fe2;
            }
            if (*local_60 != 0x3b) {
              xmlFatalErr(ctxt,XML_ERR_ENTITYREF_SEMICOL_MISSING,(char *)0x0);
              (*xmlFree)(pxVar16);
              goto LAB_00157fe2;
            }
            str = local_60 + 1;
            ctxt->nbentities = ctxt->nbentities + 1;
            local_60 = str;
            if ((ctxt->sax == (_xmlSAXHandler *)0x0) ||
               (p_Var4 = ctxt->sax->getParameterEntity, p_Var4 == (getParameterEntitySAXFunc)0x0)) {
              local_70 = (xmlEntityPtr)0x0;
            }
            else {
              local_70 = (*p_Var4)(ctxt->userData,pxVar16);
            }
            if (ctxt->instate == XML_PARSER_EOF) {
              (*xmlFree)(pxVar16);
              local_70 = (xmlEntityPtr)0x0;
            }
            else {
              if (local_70 == (xmlEntityPtr)0x0) {
                if ((ctxt->standalone == 1) ||
                   ((ctxt->hasExternalSubset == 0 && (ctxt->hasPErefs == 0)))) {
                  xmlFatalErrMsgStr(ctxt,XML_ERR_UNDECLARED_ENTITY,"PEReference: %%%s; not found\n",
                                    pxVar16);
                }
                else {
                  xmlWarningMsg(ctxt,XML_WAR_UNDECLARED_ENTITY,"PEReference: %%%s; not found\n",
                                pxVar16,str2);
                  ctxt->valid = 0;
                }
                xmlParserEntityCheck(ctxt,0,(xmlEntityPtr)0x0,0);
              }
              else if ((local_70->etype & ~XML_INTERNAL_GENERAL_ENTITY) !=
                       XML_INTERNAL_PARAMETER_ENTITY) {
                xmlWarningMsg(ctxt,XML_WAR_UNDECLARED_ENTITY,"%%%s; is not a parameter entity\n",
                              pxVar16,str2);
              }
              ctxt->hasPErefs = 1;
              (*xmlFree)(pxVar16);
            }
          }
          xmlParserEntityCheck(ctxt,0,local_70,0);
          uVar24 = local_58;
          if (local_70 != (xmlEntityPtr)0x0) {
            ctxt->nbentities = ctxt->nbentities + (long)(local_70->checked / 2);
            if (local_70->content == (xmlChar *)0x0) {
              if (((ctxt->options & 0x12) == 0) && (ctxt->validate == 0)) {
                xmlWarningMsg(ctxt,XML_ERR_ENTITY_PROCESSING,
                              "not validating will not read content for PE entity %s\n",
                              local_70->name,str2);
              }
              else if ((local_70->etype == XML_EXTERNAL_GENERAL_PARSED_ENTITY) ||
                      (local_70->etype == XML_EXTERNAL_PARAMETER_ENTITY)) {
                piVar13 = __xmlParserDebugEntities();
                if (*piVar13 != 0) {
                  pp_Var14 = __xmlGenericError();
                  p_Var5 = *pp_Var14;
                  ppvVar15 = __xmlGenericErrorContext();
                  (*p_Var5)(*ppvVar15,"Reading %s entity content input\n",local_70->name);
                }
                local_48 = xmlBufferCreate();
                if (local_48 == (xmlBufferPtr)0x0) {
                  xmlFatalErr(ctxt,XML_ERR_INTERNAL_ERROR,"xmlLoadEntityContent parameter error");
                }
                else {
                  input = xmlNewEntityInputStream(ctxt,local_70);
                  if (input == (xmlParserInputPtr)0x0) {
                    xmlFatalErr(ctxt,XML_ERR_INTERNAL_ERROR,"xmlLoadEntityContent input error");
                  }
                  else {
                    iVar10 = xmlPushInput(ctxt,input);
                    if (-1 < iVar10) {
                      if ((ctxt->progressive == 0) &&
                         ((long)ctxt->input->end - (long)ctxt->input->cur < 0xfa)) {
                        xmlGROW(ctxt);
                      }
                      do {
                        uVar9 = xmlCurrentChar(ctxt,(int *)&local_60);
                        iVar10 = 0;
                        do {
                          pxVar6 = ctxt->input;
                          if (pxVar6 != input) {
                            if ((int)uVar9 < 0x100) {
                              if ((int)uVar9 < 0x20) {
LAB_00158532:
                                if ((0xd < uVar9) || ((0x2600U >> (uVar9 & 0x1f) & 1) == 0))
                                goto LAB_001586bd;
                              }
                            }
                            else {
                              bVar26 = uVar9 - 0xe000 < 0x1ffe;
                              bVar27 = uVar9 - 0x10000 < 0x100000;
LAB_0015868a:
                              if (!(bool)(uVar9 < 0xd800 | bVar26) && !bVar27) {
LAB_001586bd:
                                xmlFatalErrMsgInt(ctxt,XML_ERR_INVALID_CHAR,
                                                  "xmlLoadEntityContent: invalid char value %d\n",
                                                  uVar9);
                                xmlBufferFree(local_48);
                                goto LAB_001583c5;
                              }
                            }
LAB_0015869f:
                            local_70->content = local_48->content;
                            local_48->content = (xmlChar *)0x0;
                            xmlBufferFree(local_48);
                            goto LAB_001583c5;
                          }
                          if (pxVar6->end <= pxVar6->cur) {
                            xmlPopInput(ctxt);
                            goto LAB_0015869f;
                          }
                          if ((int)uVar9 < 0x100) {
                            if (((0xd < uVar9) || ((0x2600U >> (uVar9 & 0x1f) & 1) == 0)) &&
                               ((int)uVar9 < 0x20)) goto LAB_00158532;
                          }
                          else if (0xfffff < uVar9 - 0x10000 &&
                                   (0x1ffd < uVar9 - 0xe000 && 0xd7ff < uVar9)) {
                            bVar27 = false;
                            bVar26 = false;
                            goto LAB_0015868a;
                          }
                          xmlBufferAdd(local_48,pxVar6->cur,(int)local_60);
                          if (iVar10 < 0x65) {
                            iVar10 = iVar10 + 1;
                          }
                          else {
                            if ((ctxt->progressive == 0) &&
                               ((long)ctxt->input->end - (long)ctxt->input->cur < 0xfa)) {
                              xmlGROW(ctxt);
                            }
                            iVar10 = 0;
                            if (ctxt->instate == XML_PARSER_EOF) goto LAB_001583b3;
                          }
                          pxVar6 = ctxt->input;
                          if (*pxVar6->cur == '\n') {
                            pxVar6->line = pxVar6->line + 1;
                            pxVar6->col = 1;
                          }
                          else {
                            pxVar6->col = pxVar6->col + 1;
                          }
                          pxVar6->cur = pxVar6->cur + (int)local_60;
                          uVar9 = xmlCurrentChar(ctxt,(int *)&local_60);
                        } while (uVar9 != 0);
                        if ((ctxt->progressive == 0) &&
                           ((long)ctxt->input->end - (long)ctxt->input->cur < 0xfa)) {
                          xmlGROW(ctxt);
                        }
                      } while (ctxt->instate != XML_PARSER_EOF);
                      xmlBufferFree(local_48);
                      goto LAB_001583c5;
                    }
                  }
LAB_001583b3:
                  xmlBufferFree(local_48);
                }
              }
              else {
                xmlFatalErr(ctxt,XML_ERR_INTERNAL_ERROR,"xmlLoadEntityContent parameter error");
              }
            }
LAB_001583c5:
            ctxt->depth = ctxt->depth + 1;
            str2 = (xmlChar *)0x0;
            pxVar16 = xmlStringDecodeEntities(ctxt,local_70->content,local_4c,'\0','\0','\0');
            ctxt->depth = ctxt->depth + -1;
            pxVar17 = pxVar16;
            pxVar19 = pxVar12;
            uVar24 = local_58;
            if (pxVar16 == (xmlChar *)0x0) goto LAB_001589d2;
            while (pxVar12 = pxVar19, *pxVar17 != '\0') {
              pxVar19 = pxVar17 + 1;
              sVar22 = sVar21 + 1;
              pxVar12[sVar21] = *pxVar17;
              uVar23 = sVar21 + 0x65;
              pxVar17 = pxVar19;
              sVar21 = sVar22;
              pxVar19 = pxVar12;
              if (uVar24 < uVar23) {
                iVar10 = xmlParserEntityCheck(ctxt,sVar22,local_70,0);
                if (iVar10 != 0) goto LAB_00158977;
                uVar23 = uVar24 * 2 + 100;
                if ((uVar23 < uVar24) ||
                   (pxVar19 = (xmlChar *)(*xmlRealloc)(pxVar12,uVar23), uVar24 = uVar23,
                   pxVar19 == (xmlChar *)0x0)) goto LAB_0015896d;
              }
            }
            local_58 = uVar24;
            (*xmlFree)(pxVar16);
            sVar22 = sVar21;
            pxVar17 = pxVar12;
            uVar24 = local_58;
          }
        }
LAB_001587d4:
        local_58 = uVar24;
        pxVar16 = (xmlChar *)0x0;
        sVar21 = sVar22;
        pxVar12 = pxVar17;
        if (str < local_38) {
          uVar9 = xmlStringCurrentChar(ctxt,str,&l);
          pxVar16 = (xmlChar *)(ulong)uVar9;
        }
      } while( true );
    }
    pxVar12 = (xmlChar *)0x0;
LAB_0015896d:
    xmlErrMemory(ctxt,(char *)0x0);
LAB_00158977:
    if (pxVar16 != (xmlChar *)0x0) {
      (*xmlFree)(pxVar16);
    }
LAB_001589d2:
    if (pxVar12 != (xmlChar *)0x0) {
      (*xmlFree)(pxVar12);
    }
  }
  return (xmlChar *)0x0;
}

Assistant:

xmlChar *
xmlStringLenDecodeEntities(xmlParserCtxtPtr ctxt, const xmlChar *str, int len,
		      int what, xmlChar end, xmlChar  end2, xmlChar end3) {
    xmlChar *buffer = NULL;
    size_t buffer_size = 0;
    size_t nbchars = 0;

    xmlChar *current = NULL;
    xmlChar *rep = NULL;
    const xmlChar *last;
    xmlEntityPtr ent;
    int c,l;

    if ((ctxt == NULL) || (str == NULL) || (len < 0))
	return(NULL);
    last = str + len;

    if (((ctxt->depth > 40) &&
         ((ctxt->options & XML_PARSE_HUGE) == 0)) ||
	(ctxt->depth > 1024)) {
	xmlFatalErr(ctxt, XML_ERR_ENTITY_LOOP, NULL);
	return(NULL);
    }

    /*
     * allocate a translation buffer.
     */
    buffer_size = XML_PARSER_BIG_BUFFER_SIZE;
    buffer = (xmlChar *) xmlMallocAtomic(buffer_size);
    if (buffer == NULL) goto mem_error;

    /*
     * OK loop until we reach one of the ending char or a size limit.
     * we are operating on already parsed values.
     */
    if (str < last)
	c = CUR_SCHAR(str, l);
    else
        c = 0;
    while ((c != 0) && (c != end) && /* non input consuming loop */
           (c != end2) && (c != end3) &&
           (ctxt->instate != XML_PARSER_EOF)) {

	if (c == 0) break;
        if ((c == '&') && (str[1] == '#')) {
	    int val = xmlParseStringCharRef(ctxt, &str);
	    if (val == 0)
                goto int_error;
	    COPY_BUF(0,buffer,nbchars,val);
	    if (nbchars + XML_PARSER_BUFFER_SIZE > buffer_size) {
	        growBuffer(buffer, XML_PARSER_BUFFER_SIZE);
	    }
	} else if ((c == '&') && (what & XML_SUBSTITUTE_REF)) {
	    if (xmlParserDebugEntities)
		xmlGenericError(xmlGenericErrorContext,
			"String decoding Entity Reference: %.30s\n",
			str);
	    ent = xmlParseStringEntityRef(ctxt, &str);
	    xmlParserEntityCheck(ctxt, 0, ent, 0);
	    if (ent != NULL)
	        ctxt->nbentities += ent->checked / 2;
	    if ((ent != NULL) &&
		(ent->etype == XML_INTERNAL_PREDEFINED_ENTITY)) {
		if (ent->content != NULL) {
		    COPY_BUF(0,buffer,nbchars,ent->content[0]);
		    if (nbchars + XML_PARSER_BUFFER_SIZE > buffer_size) {
			growBuffer(buffer, XML_PARSER_BUFFER_SIZE);
		    }
		} else {
		    xmlFatalErrMsg(ctxt, XML_ERR_INTERNAL_ERROR,
			    "predefined entity has no content\n");
                    goto int_error;
		}
	    } else if ((ent != NULL) && (ent->content != NULL)) {
		ctxt->depth++;
		rep = xmlStringDecodeEntities(ctxt, ent->content, what,
			                      0, 0, 0);
		ctxt->depth--;
		if (rep == NULL)
                    goto int_error;

                current = rep;
                while (*current != 0) { /* non input consuming loop */
                    buffer[nbchars++] = *current++;
                    if (nbchars + XML_PARSER_BUFFER_SIZE > buffer_size) {
                        if (xmlParserEntityCheck(ctxt, nbchars, ent, 0))
                            goto int_error;
                        growBuffer(buffer, XML_PARSER_BUFFER_SIZE);
                    }
                }
                xmlFree(rep);
                rep = NULL;
	    } else if (ent != NULL) {
		int i = xmlStrlen(ent->name);
		const xmlChar *cur = ent->name;

		buffer[nbchars++] = '&';
		if (nbchars + i + XML_PARSER_BUFFER_SIZE > buffer_size) {
		    growBuffer(buffer, i + XML_PARSER_BUFFER_SIZE);
		}
		for (;i > 0;i--)
		    buffer[nbchars++] = *cur++;
		buffer[nbchars++] = ';';
	    }
	} else if (c == '%' && (what & XML_SUBSTITUTE_PEREF)) {
	    if (xmlParserDebugEntities)
		xmlGenericError(xmlGenericErrorContext,
			"String decoding PE Reference: %.30s\n", str);
	    ent = xmlParseStringPEReference(ctxt, &str);
	    xmlParserEntityCheck(ctxt, 0, ent, 0);
	    if (ent != NULL)
	        ctxt->nbentities += ent->checked / 2;
	    if (ent != NULL) {
                if (ent->content == NULL) {
		    /*
		     * Note: external parsed entities will not be loaded,
		     * it is not required for a non-validating parser to
		     * complete external PEReferences coming from the
		     * internal subset
		     */
		    if (((ctxt->options & XML_PARSE_NOENT) != 0) ||
			((ctxt->options & XML_PARSE_DTDVALID) != 0) ||
			(ctxt->validate != 0)) {
			xmlLoadEntityContent(ctxt, ent);
		    } else {
			xmlWarningMsg(ctxt, XML_ERR_ENTITY_PROCESSING,
		  "not validating will not read content for PE entity %s\n",
		                      ent->name, NULL);
		    }
		}
		ctxt->depth++;
		rep = xmlStringDecodeEntities(ctxt, ent->content, what,
			                      0, 0, 0);
		ctxt->depth--;
		if (rep == NULL)
                    goto int_error;
                current = rep;
                while (*current != 0) { /* non input consuming loop */
                    buffer[nbchars++] = *current++;
                    if (nbchars + XML_PARSER_BUFFER_SIZE > buffer_size) {
                        if (xmlParserEntityCheck(ctxt, nbchars, ent, 0))
                            goto int_error;
                        growBuffer(buffer, XML_PARSER_BUFFER_SIZE);
                    }
                }
                xmlFree(rep);
                rep = NULL;
	    }
	} else {
	    COPY_BUF(l,buffer,nbchars,c);
	    str += l;
	    if (nbchars + XML_PARSER_BUFFER_SIZE > buffer_size) {
	        growBuffer(buffer, XML_PARSER_BUFFER_SIZE);
	    }
	}
	if (str < last)
	    c = CUR_SCHAR(str, l);
	else
	    c = 0;
    }
    buffer[nbchars] = 0;
    return(buffer);

mem_error:
    xmlErrMemory(ctxt, NULL);
int_error:
    if (rep != NULL)
        xmlFree(rep);
    if (buffer != NULL)
        xmlFree(buffer);
    return(NULL);
}